

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPassBase.hpp
# Opt level: O0

RESOURCE_STATE __thiscall
Diligent::RenderPassBase<Diligent::EngineGLImplTraits>::GetAttachmentState
          (RenderPassBase<Diligent::EngineGLImplTraits> *this,Uint32 Subpass,Uint32 Attachment)

{
  Char *pCVar1;
  undefined1 local_68 [8];
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  Uint32 Attachment_local;
  Uint32 Subpass_local;
  RenderPassBase<Diligent::EngineGLImplTraits> *this_local;
  
  msg.field_2._8_4_ = Attachment;
  msg.field_2._12_4_ = Subpass;
  if ((this->
      super_DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
      ).m_Desc.AttachmentCount <= Attachment) {
    FormatString<char[26],char[42]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Attachment < this->m_Desc.AttachmentCount",(char (*) [42])this);
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"GetAttachmentState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderPassBase.hpp"
               ,0x88);
    std::__cxx11::string::~string((string *)local_38);
  }
  if ((this->
      super_DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
      ).m_Desc.SubpassCount <= (uint)msg.field_2._12_4_) {
    FormatString<char[26],char[36]>
              ((string *)local_68,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Subpass < this->m_Desc.SubpassCount",(char (*) [36])this);
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"GetAttachmentState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderPassBase.hpp"
               ,0x89);
    std::__cxx11::string::~string((string *)local_68);
  }
  return this->m_AttachmentStates
         [(this->
          super_DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
          ).m_Desc.AttachmentCount * msg.field_2._12_4_ + msg.field_2._8_4_];
}

Assistant:

RESOURCE_STATE GetAttachmentState(Uint32 Subpass, Uint32 Attachment) const
    {
        VERIFY_EXPR(Attachment < this->m_Desc.AttachmentCount);
        VERIFY_EXPR(Subpass < this->m_Desc.SubpassCount);
        return m_AttachmentStates[this->m_Desc.AttachmentCount * Subpass + Attachment];
    }